

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

RangeList * __thiscall
SoapySDR::Device::getFrequencyRange
          (RangeList *__return_storage_ptr__,Device *this,int dir,size_t chan)

{
  pointer pRVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  RangeList subRange;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  double local_88;
  double local_80;
  size_t local_78;
  Device *local_70;
  double local_68;
  double *local_60;
  double *local_58;
  Range local_48;
  
  (*this->_vptr_Device[0x3b])(&local_a0);
  if (local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (*this->_vptr_Device[0x3d])(__return_storage_ptr__,this,(ulong)(uint)dir,chan);
    (*this->_vptr_Device[0x44])(this,(ulong)(uint)dir,chan);
    if (0x20 < (ulong)((long)local_a0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_80 = extraout_XMM0_Qa * -0.5;
      local_88 = extraout_XMM0_Qa * 0.5;
      uVar3 = 1;
      local_78 = chan;
      local_70 = this;
      do {
        (*local_70->_vptr_Device[0x3d])
                  (&local_60,local_70,(ulong)(uint)dir,chan,
                   local_a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar3);
        if (local_60 == local_58) {
LAB_0011bf31:
          if (local_60 != (double *)0x0) goto LAB_0011bf36;
        }
        else {
          dVar7 = *local_60;
          if (extraout_XMM0_Qa <= 0.0) {
            dVar6 = local_58[-2];
          }
          else {
            if (dVar7 <= local_80) {
              dVar7 = local_80;
            }
            dVar6 = local_58[-2];
            if (local_88 <= local_58[-2]) {
              dVar6 = local_88;
            }
          }
          pRVar1 = (__return_storage_ptr__->
                   super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((__return_storage_ptr__->
              super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
              super__Vector_impl_data._M_finish != pRVar1) {
            lVar5 = 0;
            uVar4 = 0;
            local_68 = dVar7;
            do {
              Range::Range(&local_48,*(double *)((long)&pRVar1->_min + lVar5) + local_68,
                           *(double *)((long)&pRVar1->_max + lVar5) + dVar6,0.0);
              pdVar2 = (double *)((long)&pRVar1->_min + lVar5);
              pdVar2[2] = local_48._step;
              *pdVar2 = local_48._min;
              pdVar2[1] = local_48._max;
              uVar4 = uVar4 + 1;
              pRVar1 = (__return_storage_ptr__->
                       super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar5 = lVar5 + 0x18;
              chan = local_78;
            } while (uVar4 < (ulong)(((long)(__return_storage_ptr__->
                                            super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pRVar1 >> 3) * -0x5555555555555555));
            goto LAB_0011bf31;
          }
LAB_0011bf36:
          operator_delete(local_60);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getFrequencyRange(const int dir, const size_t chan) const
{
    //get a list of tunable components
    const auto comps = this->listFrequencies(dir, chan);
    if (comps.empty()) return SoapySDR::RangeList();

    //get the range list for the RF component
    auto ranges = this->getFrequencyRange(dir, chan, comps.front());

    //use bandwidth setting to clip the range
    const double bw = this->getBandwidth(dir, chan);

    //add to the range list given subsequent components
    for (size_t comp_i = 1; comp_i < comps.size(); comp_i++)
    {
        const auto subRange = this->getFrequencyRange(dir, chan, comps[comp_i]);
        if (subRange.empty()) continue;

        double subRangeLow = subRange.front().minimum();
        if (bw > 0.0) subRangeLow = std::max(-bw/2, subRangeLow);

        double subRangeHigh = subRange.back().maximum();
        if (bw > 0.0) subRangeHigh = std::min(bw/2, subRangeHigh);

        for (size_t range_i = 0; range_i < ranges.size(); range_i++)
        {
            SoapySDR::Range &range = ranges[range_i];
            range = SoapySDR::Range(
                range.minimum() + subRangeLow,
                range.maximum() + subRangeHigh);
        }
    }

    return ranges;
}